

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::StringRef::compare(StringRef *this,StringRef rhs)

{
  char *__s1;
  unsigned_long *puVar1;
  ulong in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  int cmpResult;
  ulong local_10;
  int local_4;
  
  __s1 = (char *)*in_RDI;
  local_10 = in_RDX;
  puVar1 = std::min<unsigned_long>(in_RDI + 1,&local_10);
  local_4 = strncmp(__s1,in_RSI,*puVar1);
  if (local_4 == 0) {
    if ((ulong)in_RDI[1] < local_10) {
      local_4 = -1;
    }
    else if (local_10 < (ulong)in_RDI[1]) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int StringRef::compare( StringRef rhs ) const {
        auto cmpResult =
            strncmp( m_start, rhs.m_start, std::min( m_size, rhs.m_size ) );

        // This means that strncmp found a difference before the strings
        // ended, and we can return it directly
        if ( cmpResult != 0 ) {
            return cmpResult;
        }

        // If strings are equal up to length, then their comparison results on
        // their size
        if ( m_size < rhs.m_size ) {
            return -1;
        } else if ( m_size > rhs.m_size ) {
            return 1;
        } else {
            return 0;
        }
    }